

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

void print_custom_message(object *obj,char *string,wchar_t msg_type,player *p)

{
  char *pcVar1;
  msg_tag_t mVar2;
  ushort **ppuVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  size_t local_448;
  size_t end;
  char *tag;
  char *s;
  char *next;
  char buf [1024];
  player *p_local;
  char *pcStack_18;
  wchar_t msg_type_local;
  char *string_local;
  object *obj_local;
  
  buf._1016_8_ = p;
  memset(&next,0,0x400);
  local_448 = 0;
  if (string != (char *)0x0) {
    s = strchr(string,0x7b);
    pcStack_18 = string;
    while (s != (char *)0x0) {
      strnfcat((char *)&next,0x400,&local_448,"%.*s",(ulong)(uint)((int)s - (int)pcStack_18),
               pcStack_18);
      tag = s;
      do {
        tag = tag + 1;
        bVar6 = false;
        if (*tag != '\0') {
          ppuVar3 = __ctype_b_loc();
          bVar6 = ((*ppuVar3)[(int)(uint)(byte)*tag] & 0x400) != 0;
        }
        pcVar1 = tag;
      } while (bVar6);
      pcStack_18 = s;
      if (*tag == '}') {
        end = (size_t)(s + 1);
        mVar2 = msg_tag_lookup((char *)end);
        pcStack_18 = pcVar1;
        switch(mVar2) {
        case MSG_TAG_NAME:
          if (obj == (object *)0x0) {
            strnfcat((char *)&next,0x400,&local_448,"hands");
          }
          else {
            sVar4 = object_desc((char *)&next,0x400,obj,0x40,(player *)buf._1016_8_);
            local_448 = sVar4 + local_448;
          }
          break;
        case MSG_TAG_KIND:
          if (obj == (object *)0x0) {
            strnfcat((char *)&next,0x400,&local_448,"hands");
          }
          else {
            object_kind_name(buf + (local_448 - 8),0x400 - local_448,obj->kind,true);
            sVar5 = strlen(buf + (local_448 - 8));
            local_448 = sVar5 + local_448;
          }
          break;
        case MSG_TAG_VERB:
          if ((obj != (object *)0x0) && (obj->number == '\x01')) {
            strnfcat((char *)&next,0x400,&local_448,"s");
          }
          break;
        case MSG_TAG_VERB_IS:
          if ((obj == (object *)0x0) || (1 < obj->number)) {
            strnfcat((char *)&next,0x400,&local_448,"are");
          }
          else {
            strnfcat((char *)&next,0x400,&local_448,"is");
          }
        }
      }
      pcStack_18 = pcStack_18 + 1;
      s = strchr(pcStack_18,0x7b);
    }
    strnfcat((char *)&next,0x400,&local_448,"%s",pcStack_18);
    msgt(msg_type,"%s",&next);
  }
  return;
}

Assistant:

void print_custom_message(const struct object *obj, const char *string,
		int msg_type, const struct player *p)
{
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	size_t end = 0;

	/* Not always a string */
	if (!string) return;

	next = strchr(string, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - string),
			string);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			string = s + 1;

			switch(msg_tag_lookup(tag)) {
			case MSG_TAG_NAME:
				if (obj) {
					end += object_desc(buf, 1024, obj,
						ODESC_PREFIX | ODESC_BASE, p);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_KIND:
				if (obj) {
					object_kind_name(&buf[end], 1024 - end, obj->kind, true);
					end += strlen(&buf[end]);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_VERB:
				if (obj && obj->number == 1) {
					strnfcat(buf, 1024, &end, "s");
				}
				break;
			case MSG_TAG_VERB_IS:
				if ((!obj) || (obj->number > 1)) {
					strnfcat(buf, 1024, &end, "are");
				} else {
					strnfcat(buf, 1024, &end, "is");
				}
			default:
				break;
			}
		} else
			/* An invalid tag, skip it */
			string = next + 1;

		next = strchr(string, '{');
	}
	strnfcat(buf, 1024, &end, "%s", string);

	msgt(msg_type, "%s", buf);
}